

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_diagnostics(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ostream *poVar2;
  char *__nptr;
  long lVar3;
  long *in_RSI;
  long *in_RDI;
  double dVar4;
  option_group_definition diagnostic_group;
  string progress_arg;
  bool help;
  bool version_arg;
  string *in_stack_fffffffffffff8b8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff8c0;
  string *in_stack_fffffffffffff8c8;
  byte local_702;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff908;
  allocator *paVar5;
  option_group_definition *in_stack_fffffffffffff910;
  allocator local_611;
  string local_610 [32];
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [199];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [199];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [199];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [199];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [215];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [38];
  undefined1 local_12;
  byte local_11;
  long *local_10;
  long *local_8;
  
  local_11 = 0;
  local_12 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Diagnostic options",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"version",&local_169);
  VW::config::make_option<bool>(in_stack_fffffffffffff8c8,(bool *)in_stack_fffffffffffff8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Version information",&local_191);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff910,(typed_option<bool> *)in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"audit",&local_259);
  VW::config::make_option<bool>(in_stack_fffffffffffff8c8,(bool *)in_stack_fffffffffffff8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"a",&local_281);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"print weights of features",&local_2a9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff910,(typed_option<bool> *)in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"progress",&local_371);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"P",&local_399);
  this = VW::config::
         typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::short_name(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3c0,"Progress update frequency. int: additive, float: multiplicative",&local_3c1)
  ;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"quiet",&local_489);
  VW::config::make_option<bool>(in_stack_fffffffffffff8c8,(bool *)in_stack_fffffffffffff8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4b0,"Don\'t output disgnostics and progress updates",&local_4b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff910,(typed_option<bool> *)in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"help",&local_579);
  VW::config::make_option<bool>(in_stack_fffffffffffff8c8,(bool *)in_stack_fffffffffffff8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"h",&local_5a1);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5c8,"Look here: http://hunch.net/~vw/ and click on Tutorial.",&local_5c9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff910,(typed_option<bool> *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff8c0);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff8c0);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff8c0);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff8c0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff8c0);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  (**(code **)*local_8)(local_8,local_70);
  if ((local_11 & 1) == 0) {
    paVar5 = &local_611;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"progress",paVar5);
    bVar1 = (**(code **)(*local_8 + 8))(local_8,local_610);
    local_702 = 0;
    if ((bVar1 & 1) != 0) {
      local_702 = *(byte *)((long)local_10 + 0x3439) ^ 0xff;
    }
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    if ((local_702 & 1) != 0) {
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar4 = atof(__nptr);
      *(float *)((long)local_10 + 0x361c) = (float)dVar4;
      lVar3 = std::__cxx11::string::find_first_of((char *)local_38,0x3f6d35);
      if (lVar3 == -1) {
        *(undefined1 *)((long)local_10 + 0x361a) = 1;
        if (*(float *)((long)local_10 + 0x361c) <= 1.0 && *(float *)((long)local_10 + 0x361c) != 1.0
           ) {
          poVar2 = std::operator<<((ostream *)(local_10 + 0x1c),"warning: additive --progress <int>"
                                  );
          poVar2 = std::operator<<(poVar2," can\'t be < 1: forcing to 1");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          *(undefined4 *)((long)local_10 + 0x361c) = 0x3f800000;
        }
        *(undefined4 *)(*local_10 + 0x50) = *(undefined4 *)((long)local_10 + 0x361c);
      }
      else {
        *(undefined1 *)((long)local_10 + 0x361a) = 0;
        if (1.0 < *(float *)((long)local_10 + 0x361c)) {
          if (9.0 < *(float *)((long)local_10 + 0x361c)) {
            poVar2 = std::operator<<((ostream *)(local_10 + 0x1c),
                                     "warning: multiplicative --progress <float>");
            in_stack_fffffffffffff8c0 =
                 (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::operator<<(poVar2," is > 9.0: you probably meant to use an integer");
            std::ostream::operator<<
                      (in_stack_fffffffffffff8c0,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)(local_10 + 0x1c),
                                   "warning: multiplicative --progress <float>: ");
          poVar2 = std::operator<<(poVar2,local_38);
          poVar2 = std::operator<<(poVar2," is <= 1.0: adding 1.0");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          *(float *)((long)local_10 + 0x361c) = *(float *)((long)local_10 + 0x361c) + 1.0;
        }
        *(undefined4 *)(*local_10 + 0x50) = 0x3f800000;
      }
    }
    VW::config::option_group_definition::~option_group_definition
              ((option_group_definition *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_38);
    return;
  }
  version_struct::to_string_abi_cxx11_((version_struct *)this);
  poVar2 = std::operator<<((ostream *)&std::cout,local_5f0);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_5f0);
  exit(0);
}

Assistant:

void parse_diagnostics(options_i& options, vw& all)
{
  bool version_arg = false;
  bool help = false;
  std::string progress_arg;
  option_group_definition diagnostic_group("Diagnostic options");
  diagnostic_group.add(make_option("version", version_arg).help("Version information"))
      .add(make_option("audit", all.audit).short_name("a").help("print weights of features"))
      .add(make_option("progress", progress_arg)
               .short_name("P")
               .help("Progress update frequency. int: additive, float: multiplicative"))
      .add(make_option("quiet", all.quiet).help("Don't output disgnostics and progress updates"))
      .add(make_option("help", help).short_name("h").help("Look here: http://hunch.net/~vw/ and click on Tutorial."));

  options.add_and_parse(diagnostic_group);

  // Upon direct query for version -- spit it out to stdout
  if (version_arg)
  {
    cout << version.to_string() << "\n";
    exit(0);
  }

  if (options.was_supplied("progress") && !all.quiet)
  {
    all.progress_arg = (float)::atof(progress_arg.c_str());
    // --progress interval is dual: either integer or floating-point
    if (progress_arg.find_first_of(".") == string::npos)
    {
      // No "." in arg: assume integer -> additive
      all.progress_add = true;
      if (all.progress_arg < 1)
      {
        all.trace_message << "warning: additive --progress <int>"
                          << " can't be < 1: forcing to 1" << endl;
        all.progress_arg = 1;
      }
      all.sd->dump_interval = all.progress_arg;
    }
    else
    {
      // A "." in arg: assume floating-point -> multiplicative
      all.progress_add = false;

      if (all.progress_arg <= 1.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>: " << progress_arg << " is <= 1.0: adding 1.0"
                          << endl;
        all.progress_arg += 1.0;
      }
      else if (all.progress_arg > 9.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>"
                          << " is > 9.0: you probably meant to use an integer" << endl;
      }
      all.sd->dump_interval = 1.0;
    }
  }
}